

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O0

RK_S32 mpp_av1_assemble_fragment(AV1Context *ctx,Av1UnitFragment *frag)

{
  RK_U8 *pRVar1;
  int local_34;
  size_t sStack_30;
  RK_S32 i;
  size_t pos;
  size_t size;
  Av1UnitFragment *frag_local;
  AV1Context *ctx_local;
  
  pos = 0;
  for (local_34 = 0; local_34 < frag->nb_units; local_34 = local_34 + 1) {
    pos = frag->units[local_34].data_size + pos;
  }
  pRVar1 = (RK_U8 *)mpp_osal_malloc("mpp_av1_assemble_fragment",pos + 0x40);
  frag->data = pRVar1;
  if (frag->data == (RK_U8 *)0x0) {
    ctx_local._4_4_ = -0x3ee;
  }
  else {
    memset(frag->data + pos,0,0x40);
    sStack_30 = 0;
    for (local_34 = 0; local_34 < frag->nb_units; local_34 = local_34 + 1) {
      memcpy(frag->data + sStack_30,frag->units[local_34].data,frag->units[local_34].data_size);
      sStack_30 = frag->units[local_34].data_size + sStack_30;
    }
    if ((sStack_30 != pos) &&
       (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,"pos == size",
                   "mpp_av1_assemble_fragment",0xc13), (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    frag->data_size = pos;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

RK_S32 mpp_av1_assemble_fragment(AV1Context *ctx, Av1UnitFragment *frag)
{
    size_t size, pos;
    RK_S32 i;
    (void)ctx;
    size = 0;
    for (i = 0; i < frag->nb_units; i++)
        size += frag->units[i].data_size;

    frag->data = mpp_malloc(RK_U8, size + BUFFER_PADDING_SIZE);
    if (!frag->data)
        return MPP_ERR_NOMEM;

    memset(frag->data + size, 0, BUFFER_PADDING_SIZE);

    pos = 0;
    for (i = 0; i < frag->nb_units; i++) {
        memcpy(frag->data + pos, frag->units[i].data,
               frag->units[i].data_size);
        pos += frag->units[i].data_size;
    }
    mpp_assert(pos == size);
    frag->data_size = size;

    return 0;
}